

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

void __thiscall
GrcManager::DebugXmlGlyphs(GrcManager *this,GrcFont *pfont,ofstream *strmOut,string *staPathToCur)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  GrcSymbolTable *pGVar4;
  pointer ppGVar5;
  GrcSymbolTableEntry *pGVar6;
  GdlRenderer *this_00;
  pointer pGVar7;
  bool bVar8;
  __type _Var9;
  uint uVar10;
  int iVar11;
  Symbol pGVar12;
  ostream *poVar13;
  utf16 *rgchwUniToGlyphID;
  uint *rgnGlyphIDToUni;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong local_2a8;
  bool fShadow;
  bool fOverride;
  undefined8 local_290;
  string staExpType;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vstaSingleMemberClassFiles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vstaSingleMemberClasses;
  vector<int,_std::allocator<int>_> vnSingleMemberClassLines;
  int munitPR;
  int nPR;
  string local_1d8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vnXUniForPsd;
  vector<unsigned_short,_std::allocator<unsigned_short>_> vwXPsdForUni;
  GdlExpression *pexp;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::operator<<((ostream *)strmOut,"  <glyphAttrs>\n");
  pGVar4 = this->m_psymtbl;
  std::__cxx11::string::string((string *)&local_90,"*actualForPseudo*",(allocator *)&staExpType);
  pGVar12 = GrcSymbolTable::FindSymbol(pGVar4,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  uVar1 = pGVar12->m_nInternalID;
  pGVar4 = this->m_psymtbl;
  std::__cxx11::string::string((string *)&local_b0,"breakweight",(allocator *)&staExpType);
  pGVar12 = GrcSymbolTable::FindSymbol(pGVar4,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  uVar10 = pGVar12->m_nInternalID;
  pGVar4 = this->m_psymtbl;
  std::__cxx11::string::string((string *)&local_d0,"directionality",(allocator *)&staExpType);
  pGVar12 = GrcSymbolTable::FindSymbol(pGVar4,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  uVar2 = pGVar12->m_nInternalID;
  if (this->m_fPassOptimizations == true) {
    pGVar4 = this->m_psymtbl;
    std::__cxx11::string::string((string *)&local_f0,"*skipPasses*",(allocator *)&staExpType);
    pGVar12 = GrcSymbolTable::FindSymbol(pGVar4,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    uVar15 = pGVar12->m_nInternalID;
    pGVar4 = this->m_psymtbl;
    std::__cxx11::string::string((string *)&local_110,"*skipPasses2*",(allocator *)&staExpType);
    pGVar12 = GrcSymbolTable::FindSymbol(pGVar4,&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    if (pGVar12 == (Symbol)0x0) {
      local_2a8 = 0;
    }
    else {
      local_2a8 = (ulong)(uint)pGVar12->m_nInternalID;
    }
  }
  else {
    local_2a8 = 0;
    uVar15 = 0;
  }
  pGVar4 = this->m_psymtbl;
  std::__cxx11::string::string((string *)&local_130,"justify",(allocator *)&local_1d8);
  std::__cxx11::string::string((string *)&local_150,"stretch",(allocator *)&vnXUniForPsd);
  GrcStructName::GrcStructName((GrcStructName *)&staExpType,&local_130,&local_150);
  GrcSymbolTable::FindSymbol(pGVar4,(GrcStructName *)&staExpType);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&staExpType);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_130);
  local_290 = (ulong)uVar15;
  uVar14 = extraout_RDX;
  for (uVar16 = 0;
      ppGVar5 = (this->m_vpsymGlyphAttrs).
                super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>.
                _M_impl.super__Vector_impl_data._M_start,
      uVar16 < (ulong)((long)(this->m_vpsymGlyphAttrs).
                             super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppGVar5 >> 3);
      uVar16 = uVar16 + 1) {
    pGVar6 = ppGVar5[uVar16];
    if ((int)uVar16 == pGVar6->m_nInternalID) {
      ExpressionDebugString_abi_cxx11_
                (&staExpType,(GrcManager *)(ulong)pGVar6->m_expt,(ExpressionType)uVar14);
      if (((((uVar10 == uVar16) || (uVar2 == uVar16)) ||
           ((uVar1 == uVar16 || ((local_290 == uVar16 || (local_2a8 == uVar16)))))) ||
          (bVar8 = GrcSymbolTableEntry::IsPointField(pGVar6), bVar8)) ||
         (bVar8 = GrcSymbolTableEntry::IsComponentBoxField(pGVar6), bVar8)) {
        std::__cxx11::string::assign((char *)&staExpType);
      }
      poVar13 = std::operator<<((ostream *)strmOut,"    <glyphAttr name=\"");
      GrcSymbolTableEntry::FullName_abi_cxx11_(&local_1d8,pGVar6);
      poVar13 = std::operator<<(poVar13,(string *)&local_1d8);
      poVar13 = std::operator<<(poVar13,"\" attrId=\"");
      poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
      poVar13 = std::operator<<(poVar13,"\" type=\"");
      poVar13 = std::operator<<(poVar13,(string *)&staExpType);
      std::operator<<(poVar13,"\" />\n");
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)&staExpType);
      uVar14 = extraout_RDX_00;
    }
  }
  std::operator<<((ostream *)strmOut,"  </glyphAttrs>\n\n");
  iVar3 = pfont->m_cnUnicode;
  uVar16 = 0xffffffffffffffff;
  if (-1 < (long)iVar3) {
    uVar16 = (long)iVar3 * 2;
  }
  rgchwUniToGlyphID = (utf16 *)operator_new__(uVar16);
  rgnGlyphIDToUni = (uint *)operator_new__(0x40000);
  vnXUniForPsd.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vnXUniForPsd.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vnXUniForPsd.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vwXPsdForUni.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vwXPsdForUni.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vwXPsdForUni.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CmapAndInverse(this,pfont,iVar3,rgchwUniToGlyphID,rgnGlyphIDToUni,&vnXUniForPsd,&vwXPsdForUni);
  std::operator<<((ostream *)strmOut,"  <glyphs>\n");
  vstaSingleMemberClasses.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vstaSingleMemberClasses.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vstaSingleMemberClasses.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vstaSingleMemberClassFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vstaSingleMemberClassFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vstaSingleMemberClassFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vnSingleMemberClassLines.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vnSingleMemberClassLines.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vnSingleMemberClassLines.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = this->m_prndr;
  std::__cxx11::string::string((string *)&local_170,(string *)staPathToCur);
  GdlRenderer::RecordSingleMemberClasses
            (this_00,&vstaSingleMemberClasses,&vstaSingleMemberClassFiles,&vnSingleMemberClassLines,
             &local_170);
  std::__cxx11::string::~string((string *)&local_170);
  iVar3 = this->m_fxdGlatTableVersion;
  for (uVar10 = 0; uVar16 = (ulong)uVar10, uVar16 < this->m_cwGlyphIDs; uVar10 = uVar10 + 1) {
    poVar13 = std::operator<<((ostream *)strmOut,"    <glyph glyphid=\"");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
    if (uVar16 < (ulong)((long)vstaSingleMemberClasses.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)vstaSingleMemberClasses.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5)) {
      bVar8 = std::operator!=(vstaSingleMemberClasses.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar16,"");
      if (bVar8) {
        poVar13 = std::operator<<((ostream *)strmOut,"\" className=\"");
        std::operator<<(poVar13,(string *)
                                (vstaSingleMemberClasses.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + uVar16));
      }
    }
    uVar15 = rgnGlyphIDToUni[uVar16];
    if (uVar15 != 0) {
      std::operator<<((ostream *)strmOut,"\" usv=\"");
      DebugUnicode((ostream *)strmOut,uVar15,false);
    }
    if (uVar16 < (ulong)((long)vstaSingleMemberClassFiles.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)vstaSingleMemberClassFiles.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5)) {
      bVar8 = std::operator!=(vstaSingleMemberClassFiles.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar16,"");
      if (bVar8) {
        poVar13 = std::operator<<((ostream *)strmOut,"\" inFile=\"");
        poVar13 = std::operator<<(poVar13,(string *)
                                          (vstaSingleMemberClassFiles.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start + uVar16));
        poVar13 = std::operator<<(poVar13,"\" atLine=\"");
        std::ostream::operator<<
                  (poVar13,vnSingleMemberClassLines.super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start[uVar16]);
      }
    }
    poVar13 = std::operator<<((ostream *)strmOut,"\"");
    std::operator<<(poVar13,">\n");
    local_290 = CONCAT44(local_290._4_4_,uVar10) & 0xffffffff0000ffff;
    for (uVar15 = 0; uVar17 = (ulong)uVar15,
        uVar17 < (ulong)((long)(this->m_vpsymGlyphAttrs).
                               super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->m_vpsymGlyphAttrs).
                               super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3); uVar15 = uVar15 + 1)
    {
      iVar11 = FinalAttrValue(this,(gid16)local_290,uVar15);
      if (((uVar1 != uVar15) || (iVar11 != 0)) &&
         ((bVar8 = GrcSymbolTableEntry::IsMirrorAttr
                             ((this->m_vpsymGlyphAttrs).
                              super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar17]),
          !bVar8 && uVar2 != uVar15 || (0 < this->m_prndr->m_nBidi)))) {
        staExpType._M_dataplus._M_p = (pointer)0xffffffffffffffff;
        staExpType._M_string_length = (long)&staExpType.field_2 + 8;
        staExpType.field_2._M_allocated_capacity = 0;
        staExpType.field_2._M_local_buf[8] = '\0';
        GrcGlyphAttrMatrix::Get
                  (this->m_pgax,(gid16)local_290,uVar15,&pexp,&nPR,&munitPR,&fOverride,&fShadow,
                   (GrpLineAndFile *)&staExpType);
        if ((((this->m_vpsymGlyphAttrs).
              super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar17]->m_fUserDefined != true) ||
            (bVar8 = GrcGlyphAttrMatrix::Defined(this->m_pgax,(gid16)local_290,uVar15,0), bVar8)) &&
           ((bVar8 = GdlRenderer::HasCollisionPass(this->m_prndr), bVar8 ||
            (bVar8 = GrcSymbolTableEntry::IsCollisionAttr
                               ((this->m_vpsymGlyphAttrs).
                                super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar17]), !bVar8)))) {
          poVar13 = std::operator<<((ostream *)strmOut,"      <glyphAttrValue name=\"");
          GrcSymbolTableEntry::FullName_abi_cxx11_
                    (&local_1d8,
                     (this->m_vpsymGlyphAttrs).
                     super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar17]);
          poVar13 = std::operator<<(poVar13,(string *)&local_1d8);
          std::operator<<(poVar13,"\" value=\"");
          std::__cxx11::string::~string((string *)&local_1d8);
          pGVar6 = (this->m_vpsymGlyphAttrs).
                   super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar17];
          std::__cxx11::string::string((string *)&local_50,"gpoint",(allocator *)&local_1d8);
          _Var9 = std::operator==(&pGVar6->m_staFieldName,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          if ((iVar11 == -2) && (_Var9)) {
            std::operator<<((ostream *)strmOut,"zero");
          }
          else {
            std::ostream::operator<<(strmOut,iVar11);
          }
          if ((int)staExpType._M_dataplus._M_p != -1) {
            poVar13 = std::operator<<((ostream *)strmOut,"\" inFile=\"");
            std::__cxx11::string::string((string *)&local_70,(string *)staPathToCur);
            GrpLineAndFile::FileWithPath(&local_1d8,(GrpLineAndFile *)&staExpType,&local_70);
            poVar13 = std::operator<<(poVar13,(string *)&local_1d8);
            poVar13 = std::operator<<(poVar13,"\" atLine=\"");
            std::ostream::operator<<(poVar13,staExpType._M_dataplus._M_p._4_4_);
            std::__cxx11::string::~string((string *)&local_1d8);
            std::__cxx11::string::~string((string *)&local_70);
          }
          std::operator<<((ostream *)strmOut,"\" />\n");
        }
        std::__cxx11::string::~string((string *)&staExpType._M_string_length);
      }
    }
    if (((0x2ffff < iVar3) && (uVar10 < this->m_wGlyphIDLim)) &&
       (pGVar7 = (this->m_vgbdy).
                 super__Vector_base<GlyphBoundaries,_std::allocator<GlyphBoundaries>_>._M_impl.
                 super__Vector_impl_data._M_start,
       uVar10 < (uint)(((long)(this->m_vgbdy).
                              super__Vector_base<GlyphBoundaries,_std::allocator<GlyphBoundaries>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)pGVar7) / 0x680))) {
      GlyphBoundaries::DebugXml(pGVar7 + uVar16,strmOut);
    }
    std::operator<<((ostream *)strmOut,"    </glyph>\n");
  }
  std::operator<<((ostream *)strmOut,"  </glyphs>\n\n");
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&vnSingleMemberClassLines.super__Vector_base<int,_std::allocator<int>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vstaSingleMemberClassFiles);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vstaSingleMemberClasses);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            (&vwXPsdForUni.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&vnXUniForPsd.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return;
}

Assistant:

void GrcManager::DebugXmlGlyphs(GrcFont * pfont, std::ofstream & strmOut,
	std::string staPathToCur)
{
	// Glyph attribute definitions

	strmOut << "  <glyphAttrs>\n";

	Symbol psymActual = m_psymtbl->FindSymbol("*actualForPseudo*");
	unsigned int nAttrIdActual = psymActual->InternalID();
	Symbol psymBw = m_psymtbl->FindSymbol("breakweight");
	unsigned int nAttrIdBw = psymBw->InternalID();
	Symbol psymDir = m_psymtbl->FindSymbol("directionality");
	unsigned int nAttrIdDir = psymDir->InternalID();
	Symbol psymSkipP = NULL;
	unsigned int nAttrIdSkipP = 0;
	Symbol psymSkipP2 = NULL;
	unsigned int nAttrIdSkipP2 = 0;
	if (this->IncludePassOptimizations())
	{
		psymSkipP = m_psymtbl->FindSymbol("*skipPasses*");
		nAttrIdSkipP = psymSkipP->InternalID();
		psymSkipP2 = m_psymtbl->FindSymbol("*skipPasses2*");
		if (psymSkipP2)
			nAttrIdSkipP2 = psymSkipP2->InternalID();
	}

	//Symbol psymJStr = m_psymtbl->FindSymbol(GrcStructName("justify", "0", "stretch"));
	Symbol psymJStr = m_psymtbl->FindSymbol(GrcStructName("justify", "stretch"));
	int nAttrIdJStr = psymJStr->InternalID();

	for (size_t nAttrID = 0; nAttrID < m_vpsymGlyphAttrs.size(); nAttrID++)
	{
		Symbol psymGlyphAttr = m_vpsymGlyphAttrs[nAttrID];

		//if ((psymGlyphAttr->IsMirrorAttr() || nAttrID == nAttrIdDir)
		//		&& !m_prndr->Bidi())
		//	continue;

		if (psymGlyphAttr->InternalID() == static_cast<int>(nAttrID))
		{
			std::string staExpType = ExpressionDebugString(psymGlyphAttr->ExpType());
			if (nAttrID == nAttrIdBw)
				staExpType = "bw";
			else if (nAttrID == nAttrIdDir)
				staExpType = "dircode";
			else if (nAttrID == nAttrIdActual)
				staExpType = "gid";
			else if (nAttrID == nAttrIdSkipP || nAttrID == nAttrIdSkipP2)
				staExpType = "bitmap";
			else if (psymGlyphAttr->IsPointField())
				staExpType = "point";
			else if (psymGlyphAttr->IsComponentBoxField())
				staExpType = "comp";

			strmOut << "    <glyphAttr name=\"" << psymGlyphAttr->FullName() 
				<< "\" attrId=\"" << nAttrID 
				<< "\" type=\"" << staExpType
				<< "\" />\n";
		}
		// else we have something like justify.stretch which is unused
	}

	strmOut << "  </glyphAttrs>\n\n";

	// Glyphs and their attribute values

	// Generate the cmap.
	int cnUni = pfont->NumUnicode();
	utf16 * rgchwUniToGlyphID = new utf16[cnUni];
	unsigned int * rgnGlyphIDToUni = new unsigned int[0x10000];
	std::vector<unsigned int> vnXUniForPsd;
	std::vector<utf16> vwXPsdForUni;
	CmapAndInverse(pfont, cnUni, rgchwUniToGlyphID, rgnGlyphIDToUni,
		vnXUniForPsd, vwXPsdForUni);

	strmOut << "  <glyphs>\n";

	std::vector<std::string> vstaSingleMemberClasses;
	std::vector<std::string> vstaSingleMemberClassFiles;
	std::vector<int> vnSingleMemberClassLines;
	m_prndr->RecordSingleMemberClasses(vstaSingleMemberClasses,
		vstaSingleMemberClassFiles, vnSingleMemberClassLines, staPathToCur);

	int fxdGlatVersion = TableVersion(ktiGlat);

	for (auto wGlyphID = 0U; wGlyphID < m_cwGlyphIDs; wGlyphID++)
	{
		// Convert breakweight values depending on the table version to output.
		////ConvertBwForVersion(wGlyphID, nAttrIdBw);

		//	Split any large stretch values into two 16-bit words.
		////SplitLargeStretchValue(wGlyphID, nAttrIdJStr);

		strmOut << "    <glyph glyphid=\"" << wGlyphID;
		if (vstaSingleMemberClasses.size() > (unsigned)wGlyphID && vstaSingleMemberClasses[wGlyphID] != "")
			strmOut << "\" className=\"" << vstaSingleMemberClasses[wGlyphID];
		if (rgnGlyphIDToUni[wGlyphID] != 0)
		{
			strmOut << "\" usv=\""; 
			DebugUnicode(strmOut, rgnGlyphIDToUni[wGlyphID], false);
		}
		if (vstaSingleMemberClassFiles.size() > (unsigned)wGlyphID && vstaSingleMemberClassFiles[wGlyphID] != "")
			strmOut << "\" inFile=\"" << vstaSingleMemberClassFiles[wGlyphID]
				<< "\" atLine=\"" << vnSingleMemberClassLines[wGlyphID];
		strmOut<< "\"" << ">\n";
	
		for (auto nAttrID = 0U; nAttrID < m_vpsymGlyphAttrs.size(); nAttrID++)
		{
			int nValue = FinalAttrValue(wGlyphID, nAttrID);

			if (nAttrID == nAttrIdActual && nValue == 0)
				continue;

			if ((m_vpsymGlyphAttrs[nAttrID]->IsMirrorAttr() || nAttrID == nAttrIdDir)
					&& m_prndr->Bidi() == 0)
				// Ignore mirror and directionality attribute for non-bidi.
				continue;

			// Get the original expression where this attribute was set.
			GdlExpression * pexp;
			int nPR;
			int munitPR;
			bool fOverride, fShadow;
			GrpLineAndFile lnf;
			m_pgax->Get(wGlyphID, nAttrID,
				&pexp, &nPR, &munitPR, &fOverride, &fShadow, &lnf);

			if (m_vpsymGlyphAttrs[nAttrID]->IsUserDefined() && !m_pgax->Defined(wGlyphID, nAttrID))
				// Attribute not defined for this glyph.
				continue;

			if (! m_prndr->HasCollisionPass() && m_vpsymGlyphAttrs[nAttrID]->IsCollisionAttr())
				// Ignore collision attributes when there is no collision pass.
				continue;

			strmOut << "      <glyphAttrValue name=\"" << m_vpsymGlyphAttrs[nAttrID]->FullName()
				<< "\" value=\"";
			if (m_vpsymGlyphAttrs[nAttrID]->LastFieldIs("gpoint") && nValue == kGpointZero)
				strmOut << "zero";
			else
				strmOut  << nValue;

			if (!lnf.NotSet())
				strmOut << "\" inFile=\"" << lnf.FileWithPath(staPathToCur)
					<< "\" atLine=\"" << lnf.OriginalLine();

			strmOut << "\" />\n";
		}

		if (fxdGlatVersion >= 0x00030000)
		{
			// Output glyph-approximation octaboxes.
			if (wGlyphID < m_wGlyphIDLim && wGlyphID < (int)m_vgbdy.size())
				m_vgbdy[wGlyphID].DebugXml(strmOut);
		}

		strmOut << "    </glyph>\n";
	}

	strmOut << "  </glyphs>\n\n";
}